

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

bool anon_unknown.dwarf_206e9::StrEqVerbose(string *a,string *b,string *text)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = a->_M_string_length;
  bVar2 = true;
  if (__n == b->_M_string_length) {
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
      bVar2 = iVar1 != 0;
    }
  }
  if (bVar2 != false) {
    printf("EXPECTED: %s\n",(a->_M_dataplus)._M_p);
    printf("ACTUAL: %s\n",(b->_M_dataplus)._M_p);
    printf("TEXT: %s\n",(text->_M_dataplus)._M_p);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool StrEqVerbose(const string& a, const string& b,
                         const string& text) {
  if (a != b) {
    printf("EXPECTED: %s\n", a.c_str());
    printf("ACTUAL: %s\n", b.c_str());
    printf("TEXT: %s\n", text.c_str());
    return false;
  }
  return true;
}